

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O1

fields absl::lts_20240722::time_internal::cctz::detail::impl::n_day
                 (year_t y,month_t m,diff_t d,diff_t cd,hour_t hh,minute_t mm,second_t ss)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  fields fVar11;
  
  lVar4 = (cd / 0x23ab1) * 400;
  lVar9 = cd % 0x23ab1;
  lVar6 = lVar4 + -400;
  if (-1 < lVar9) {
    lVar6 = lVar4;
  }
  lVar4 = lVar9 + 0x23ab1;
  if (-1 < lVar9) {
    lVar4 = lVar9;
  }
  uVar7 = (d / 0x23ab1) * 400 + lVar6 + y % 400;
  lVar6 = d % 0x23ab1 + lVar4;
  if (lVar6 == 0 || SCARRY8(d % 0x23ab1,lVar4) != lVar6 < 0) {
    if (lVar6 < -0x16c) {
      uVar7 = uVar7 - 400;
      lVar6 = lVar6 + 0x23ab1;
    }
    else {
      uVar5 = (('\x02' < m) + uVar7) - 1;
      lVar4 = 0x16d;
      if ((uVar5 & 3) == 0) {
        lVar9 = uVar5 * -0x70a3d70a3d70a3d7;
        lVar4 = 0x16e;
        if ((lVar9 + 0x51eb851eb851eb8U >> 2 | lVar9 << 0x3e) < 0x28f5c28f5c28f5d) {
          lVar4 = (ulong)((lVar9 + 0x51eb851eb851eb0U >> 4 | lVar9 << 0x3c) < 0xa3d70a3d70a3d7) +
                  0x16d;
        }
      }
      uVar7 = uVar7 - 1;
      lVar6 = lVar6 + lVar4;
    }
  }
  else if (0x23ab1 < lVar6) {
    uVar7 = uVar7 + 400;
    lVar6 = lVar6 + -0x23ab1;
  }
  if (0x16d < lVar6) {
    uVar10 = (long)(uVar7 + ('\x02' < m)) % 400;
    uVar5 = (ulong)((int)uVar10 + 400);
    if (-1 < (long)uVar10) {
      uVar5 = uVar10 & 0xffffffff;
    }
    do {
      iVar2 = (int)uVar5;
      uVar10 = (ulong)(300 < iVar2 || iVar2 == 0) | 0x8eac;
      lVar4 = lVar6;
      if (lVar6 - uVar10 != 0 && (long)uVar10 <= lVar6) {
        uVar7 = uVar7 + 100;
        uVar3 = iVar2 - 300;
        if (iVar2 < 300) {
          uVar3 = iVar2 + 100;
        }
        uVar5 = (ulong)uVar3;
        lVar4 = lVar6 - uVar10;
      }
      bVar1 = (long)uVar10 < lVar6;
      lVar6 = lVar4;
    } while (bVar1);
    do {
      iVar2 = (int)uVar5;
      uVar10 = 0x5b5;
      if (iVar2 < 0x12d && iVar2 != 0) {
        uVar10 = (ulong)((iVar2 + -1) % 100 < 0x60) | 0x5b4;
      }
      lVar6 = lVar4;
      if (lVar4 - uVar10 != 0 && (long)uVar10 <= lVar4) {
        uVar7 = uVar7 + 4;
        uVar3 = iVar2 - 0x18c;
        if (iVar2 < 0x18c) {
          uVar3 = iVar2 + 4;
        }
        uVar5 = (ulong)uVar3;
        lVar6 = lVar4 - uVar10;
      }
      bVar1 = (long)uVar10 < lVar4;
      lVar4 = lVar6;
    } while (bVar1);
    do {
      lVar9 = lVar6;
      uVar5 = ('\x02' < m) + uVar7;
      lVar4 = 0x16d;
      if ((uVar5 & 3) == 0) {
        lVar6 = uVar5 * -0x70a3d70a3d70a3d7;
        lVar4 = 0x16e;
        if ((lVar6 + 0x51eb851eb851eb8U >> 2 | lVar6 << 0x3e) < 0x28f5c28f5c28f5d) {
          lVar4 = (ulong)((lVar6 + 0x51eb851eb851eb0U >> 4 | lVar6 << 0x3c) < 0xa3d70a3d70a3d7) +
                  0x16d;
        }
      }
      lVar6 = lVar4;
      if (lVar9 <= lVar4) {
        lVar6 = 0;
      }
      lVar6 = lVar9 - lVar6;
      uVar7 = uVar7 + 1;
    } while (lVar4 < lVar9);
    uVar7 = (uVar7 + (lVar4 < lVar9)) - 1;
  }
  lVar4 = lVar6;
  if (0x1c < lVar6) {
    do {
      uVar3 = 0;
      if (((uVar7 & 3) == 0) && (m == 2)) {
        lVar6 = uVar7 * -0x70a3d70a3d70a3d7;
        uVar3 = 1;
        if ((lVar6 + 0x51eb851eb851eb8U >> 2 | lVar6 << 0x3e) < 0x28f5c28f5c28f5d) {
          uVar3 = (uint)((lVar6 + 0x51eb851eb851eb0U >> 4 | lVar6 << 0x3c) < 0xa3d70a3d70a3d7);
        }
      }
      lVar9 = (ulong)uVar3 + (long)*(int *)(&DAT_0010d070 + (long)m * 4);
      lVar6 = lVar4;
      if (lVar4 - lVar9 != 0 && lVar9 <= lVar4) {
        bVar8 = m + 1;
        bVar1 = '\f' < (char)bVar8;
        if (SBORROW1(bVar8,'\r') == (char)(m - 0xcU) < '\0') {
          bVar8 = 1;
        }
        uVar7 = uVar7 + bVar1;
        lVar6 = lVar4 - lVar9;
        m = bVar8;
      }
      bVar1 = lVar9 < lVar4;
      lVar4 = lVar6;
    } while (bVar1);
  }
  fVar11._8_8_ = (ulong)(byte)m |
                 (ulong)(((uint)lVar6 & 0xff) << 8) |
                 (ulong)(byte)hh << 0x10 | (ulong)(byte)mm << 0x18 | (ulong)(byte)ss << 0x20;
  fVar11.y = (y - y % 400) + uVar7;
  return fVar11;
}

Assistant:

CONSTEXPR_F fields n_day(year_t y, month_t m, diff_t d, diff_t cd, hour_t hh,
                         minute_t mm, second_t ss) noexcept {
  year_t ey = y % 400;
  const year_t oey = ey;
  ey += (cd / 146097) * 400;
  cd %= 146097;
  if (cd < 0) {
    ey -= 400;
    cd += 146097;
  }
  ey += (d / 146097) * 400;
  d = d % 146097 + cd;
  if (d > 0) {
    if (d > 146097) {
      ey += 400;
      d -= 146097;
    }
  } else {
    if (d > -365) {
      // We often hit the previous year when stepping a civil time backwards,
      // so special case it to avoid counting up by 100/4/1-year chunks.
      ey -= 1;
      d += days_per_year(ey, m);
    } else {
      ey -= 400;
      d += 146097;
    }
  }
  if (d > 365) {
    int yi = year_index(ey, m);  // Index into Gregorian 400 year cycle.
    for (;;) {
      int n = days_per_century(yi);
      if (d <= n) break;
      d -= n;
      ey += 100;
      yi += 100;
      if (yi >= 400) yi -= 400;
    }
    for (;;) {
      int n = days_per_4years(yi);
      if (d <= n) break;
      d -= n;
      ey += 4;
      yi += 4;
      if (yi >= 400) yi -= 400;
    }
    for (;;) {
      int n = days_per_year(ey, m);
      if (d <= n) break;
      d -= n;
      ++ey;
    }
  }
  if (d > 28) {
    for (;;) {
      int n = days_per_month(ey, m);
      if (d <= n) break;
      d -= n;
      if (++m > 12) {
        ++ey;
        m = 1;
      }
    }
  }
  return fields(y + (ey - oey), m, static_cast<day_t>(d), hh, mm, ss);
}